

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::TokenManager::GetKeyId
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aKeyId)

{
  bool bVar1;
  Error *pEVar2;
  ErrorCode local_ac;
  Error local_a8;
  ErrorCode local_7c;
  Error local_78;
  undefined1 local_40 [8];
  CborMap token;
  ByteArray *aKeyId_local;
  TokenManager *this_local;
  Error *error;
  
  token.super_CborValue.mCbor._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  CborMap::CborMap((CborMap *)local_40);
  ValidateToken(&local_78,this,(CborMap *)local_40,&this->mSignedToken,&this->mDomainCAPublicKey);
  pEVar2 = Error::operator=(__return_storage_ptr__,&local_78);
  local_7c = kNone;
  bVar1 = commissioner::operator!=(pEVar2,&local_7c);
  Error::~Error(&local_78);
  if (!bVar1) {
    GetKeyId(&local_a8,this,aKeyId,(CborMap *)local_40);
    pEVar2 = Error::operator=(__return_storage_ptr__,&local_a8);
    local_ac = kNone;
    commissioner::operator!=(pEVar2,&local_ac);
    Error::~Error(&local_a8);
  }
  CborValue::Free((CborValue *)local_40);
  token.super_CborValue.mCbor._7_1_ = 1;
  CborMap::~CborMap((CborMap *)local_40);
  if ((token.super_CborValue.mCbor._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::GetKeyId(ByteArray &aKeyId) const
{
    Error   error;
    CborMap token;

    SuccessOrExit(error = ValidateToken(token, mSignedToken, mDomainCAPublicKey));
    SuccessOrExit(error = GetKeyId(aKeyId, token));

exit:
    token.Free();
    return error;
}